

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

unique_ptr<Entry<ON_SimpleArray<unsigned_char>_>,_std::default_delete<Entry<ON_SimpleArray<unsigned_char>_>_>_>
 make_entry<ON_SimpleArray<unsigned_char>>(ON_SimpleArray<unsigned_char> *value)

{
  ON_SimpleArray<unsigned_char> *value_local;
  
  std::make_unique<Entry<ON_SimpleArray<unsigned_char>>,ON_SimpleArray<unsigned_char>const&>(value);
  return (__uniq_ptr_data<Entry<ON_SimpleArray<unsigned_char>_>,_std::default_delete<Entry<ON_SimpleArray<unsigned_char>_>_>,_true,_true>
          )(__uniq_ptr_data<Entry<ON_SimpleArray<unsigned_char>_>,_std::default_delete<Entry<ON_SimpleArray<unsigned_char>_>_>,_true,_true>
            )value;
}

Assistant:

static std::unique_ptr<Entry<T>> make_entry(const T& value)
{
  return std::make_unique<Entry<T>>(value);
}